

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

void Nwk_ObjReplace(Nwk_Obj_t *pNodeOld,Nwk_Obj_t *pNodeNew)

{
  if (pNodeOld->pMan != pNodeNew->pMan) {
    __assert_fail("pNodeOld->pMan == pNodeNew->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x130,"void Nwk_ObjReplace(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pNodeOld != pNodeNew) {
    if (0 < pNodeOld->nFanouts) {
      Nwk_ObjTransferFanout(pNodeOld,pNodeNew);
      Nwk_ManDeleteNode_rec(pNodeOld);
      return;
    }
    __assert_fail("Nwk_ObjFanoutNum(pNodeOld) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x132,"void Nwk_ObjReplace(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  __assert_fail("pNodeOld != pNodeNew",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0x131,"void Nwk_ObjReplace(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjReplace( Nwk_Obj_t * pNodeOld, Nwk_Obj_t * pNodeNew )
{
    assert( pNodeOld->pMan == pNodeNew->pMan );
    assert( pNodeOld != pNodeNew );
    assert( Nwk_ObjFanoutNum(pNodeOld) > 0 );
    // transfer the fanouts to the old node
    Nwk_ObjTransferFanout( pNodeOld, pNodeNew );
    // remove the old node
    Nwk_ManDeleteNode_rec( pNodeOld );
}